

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcTerminatorSymbol::IfcTerminatorSymbol
          (IfcTerminatorSymbol *this,void **vtt)

{
  void **vtt_local;
  IfcTerminatorSymbol *this_local;
  
  IfcAnnotationSymbolOccurrence::IfcAnnotationSymbolOccurrence
            (&this->super_IfcAnnotationSymbolOccurrence,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcTerminatorSymbol,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcTerminatorSymbol,_1UL> *)
             &(this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.field_0x90,
             vtt + 0x17);
  *(void **)&(this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.
             super_IfcStyledItem = *vtt;
  *(void **)(&(this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.
              super_IfcStyledItem.field_0x0 +
            *(long *)(*(long *)&(this->super_IfcAnnotationSymbolOccurrence).
                                super_IfcAnnotationOccurrence.super_IfcStyledItem + -0x18)) =
       vtt[0x19];
  (this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x1a];
  *(void **)&(this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.
             super_IfcStyledItem.field_0x70 = vtt[0x1b];
  *(void **)&(this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.
             super_IfcStyledItem.field_0x80 = vtt[0x1c];
  *(void **)&(this->super_IfcAnnotationSymbolOccurrence).super_IfcAnnotationOccurrence.field_0x90 =
       vtt[0x1d];
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAnnotationCurveOccurrence>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcAnnotationCurveOccurrence> *)
             &(this->super_IfcAnnotationSymbolOccurrence).field_0xa0,(LazyObject *)0x0);
  return;
}

Assistant:

IfcTerminatorSymbol() : Object("IfcTerminatorSymbol") {}